

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FieldMapTestCase.cpp
# Opt level: O3

void __thiscall SuiteFieldMapTests::TesttotalFields::RunImpl(TesttotalFields *this)

{
  pointer pcVar1;
  TestResults *results;
  undefined8 uVar2;
  TestResults **ppTVar3;
  TestDetails **ppTVar4;
  FieldMap group1;
  FieldMap group2;
  FieldMap fieldMap;
  _Alloc_hider local_190;
  undefined1 auStack_188 [28];
  int local_16c;
  unsigned_long local_168;
  message_order local_160 [3];
  message_order local_f0 [3];
  FieldMap local_80 [112];
  
  local_160[0].m_mode = normal;
  local_160[0].m_delim = 0;
  local_160[0].m_groupOrder.m_size._0_4_ = 0;
  local_160[0].m_groupOrder.m_size._4_4_ = 0;
  local_160[0].m_groupOrder.m_buffer._0_4_ = 0;
  local_160[0].m_groupOrder.m_buffer._4_4_ = 0;
  local_160[0].m_largest = 0;
  FIX::FieldMap::FieldMap(local_80,local_160);
  FIX::shared_array<int>::release(&local_160[0].m_groupOrder);
  uVar2 = &local_160[0].m_groupOrder.m_buffer;
  local_160[0]._0_8_ = uVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_160,"field1","");
  FIX::FieldMap::setField(local_80,1,(string *)local_160);
  if (local_160[0]._0_8_ != uVar2) {
    operator_delete((void *)local_160[0]._0_8_,
                    CONCAT44(local_160[0].m_groupOrder.m_buffer._4_4_,
                             local_160[0].m_groupOrder.m_buffer._0_4_) + 1);
  }
  local_160[0]._0_8_ = uVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_160,"field2","");
  FIX::FieldMap::setField(local_80,2,(string *)local_160);
  if (local_160[0]._0_8_ != uVar2) {
    operator_delete((void *)local_160[0]._0_8_,
                    CONCAT44(local_160[0].m_groupOrder.m_buffer._4_4_,
                             local_160[0].m_groupOrder.m_buffer._0_4_) + 1);
  }
  local_160[0]._0_8_ = uVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_160,"field3","");
  FIX::FieldMap::setField(local_80,3,(string *)local_160);
  if (local_160[0]._0_8_ != uVar2) {
    operator_delete((void *)local_160[0]._0_8_,
                    CONCAT44(local_160[0].m_groupOrder.m_buffer._4_4_,
                             local_160[0].m_groupOrder.m_buffer._0_4_) + 1);
  }
  local_f0[0].m_mode = normal;
  local_f0[0].m_delim = 0;
  local_f0[0].m_groupOrder.m_size._0_4_ = 0;
  local_f0[0].m_groupOrder.m_size._4_4_ = 0;
  local_f0[0].m_groupOrder.m_buffer._0_4_ = 0;
  local_f0[0].m_groupOrder.m_buffer._4_4_ = 0;
  local_f0[0].m_largest = 0;
  FIX::FieldMap::FieldMap((FieldMap *)local_160,local_f0);
  FIX::shared_array<int>::release(&local_f0[0].m_groupOrder);
  uVar2 = &local_f0[0].m_groupOrder.m_buffer;
  local_f0[0]._0_8_ = uVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_f0,"field4","");
  FIX::FieldMap::setField((FieldMap *)local_160,4,(string *)local_f0);
  if (local_f0[0]._0_8_ != uVar2) {
    operator_delete((void *)local_f0[0]._0_8_,
                    CONCAT44(local_f0[0].m_groupOrder.m_buffer._4_4_,
                             local_f0[0].m_groupOrder.m_buffer._0_4_) + 1);
  }
  FIX::FieldMap::addGroup((int)local_80,(FieldMap *)0xa,SUB81(local_160,0));
  local_190._M_p._0_4_ = normal;
  local_190._M_p._4_4_ = 0;
  auStack_188._0_4_ = 0;
  auStack_188._4_4_ = 0;
  auStack_188._8_4_ = 0;
  auStack_188._12_4_ = 0;
  auStack_188._16_4_ = 0;
  FIX::FieldMap::FieldMap((FieldMap *)local_f0,(message_order *)&local_190);
  FIX::shared_array<int>::release((shared_array<int> *)auStack_188);
  pcVar1 = auStack_188 + 8;
  local_190._M_p = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_190,"field5","");
  FIX::FieldMap::setField((FieldMap *)local_f0,5,(string *)&local_190);
  if (local_190._M_p != pcVar1) {
    operator_delete(local_190._M_p,CONCAT44(auStack_188._12_4_,auStack_188._8_4_) + 1);
  }
  local_190._M_p = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_190,"field6","");
  FIX::FieldMap::setField((FieldMap *)local_f0,6,(string *)&local_190);
  if (local_190._M_p != pcVar1) {
    operator_delete(local_190._M_p,CONCAT44(auStack_188._12_4_,auStack_188._8_4_) + 1);
  }
  FIX::FieldMap::addGroup((int)local_80,(FieldMap *)0x14,SUB81(local_f0,0));
  ppTVar3 = UnitTest::CurrentTest::Results();
  results = *ppTVar3;
  local_16c = 8;
  local_168 = FIX::FieldMap::totalFields();
  ppTVar4 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails((TestDetails *)&local_190,*ppTVar4,0x78);
  UnitTest::CheckEqual<int,unsigned_long>(results,&local_16c,&local_168,(TestDetails *)&local_190);
  FIX::FieldMap::~FieldMap((FieldMap *)local_f0);
  FIX::FieldMap::~FieldMap((FieldMap *)local_160);
  FIX::FieldMap::~FieldMap(local_80);
  return;
}

Assistant:

TEST(totalFields)
{
  FieldMap fieldMap;
  fieldMap.setField(1, "field1");
  fieldMap.setField(2, "field2");
  fieldMap.setField(3, "field3");

  FieldMap group1;
  group1.setField(4, "field4");
  fieldMap.addGroup(10, group1);
  FieldMap group2;
  group2.setField(5, "field5");
  group2.setField(6, "field6");
  fieldMap.addGroup(20, group2);

  CHECK_EQUAL(8, fieldMap.totalFields());
}